

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * QUnicodeTables::detachAndConvertCase<QString>(QString *str,QStringIterator it,Case which)

{
  DataPointer *pDVar1;
  qint8 qVar2;
  bool bVar3;
  iterator pQVar4;
  char *pcVar5;
  QChar *pQVar6;
  const_iterator pQVar7;
  QStringIterator *pQVar8;
  int __c;
  int extraout_EDX;
  int extraout_EDX_00;
  int __c_00;
  char *in_RSI;
  QString *pQVar9;
  QString *in_RDI;
  long in_FS_OFFSET;
  R_conflict2 RVar10;
  const_iterator in_stack_00000008;
  const_iterator in_stack_00000010;
  const_iterator in_stack_00000018;
  qsizetype outpos;
  qsizetype inpos;
  QChar *pp;
  QString *s;
  R_conflict2 folded;
  QString *in_stack_ffffffffffffff18;
  QString *in_stack_ffffffffffffff20;
  QStringIterator *in_stack_ffffffffffffff28;
  const_iterator in_stack_ffffffffffffff38;
  QChar *in_stack_ffffffffffffff40;
  const_iterator in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 uVar11;
  QString *pQVar12;
  QString *local_70;
  QChar local_4a;
  QStringIterator local_48;
  QChar local_2c;
  QChar local_2a;
  char16_t local_28 [4];
  undefined2 local_20;
  R local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  pQVar12 = in_RDI;
  QString::QString(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  pQVar4 = QString::begin(in_stack_ffffffffffffff20);
  pcVar5 = QStringIterator::index((QStringIterator *)&stack0x00000008,in_RSI,__c);
  local_70 = (QString *)(pQVar4 + (long)pcVar5);
  do {
    local_18.spans = (Span *)0xaaaaaaaaaaaaaaaa;
    local_18.nSpans._0_2_ = 0xaaaa;
    QStringIterator::next
              (in_stack_ffffffffffffff28,(char32_t)((ulong)in_stack_ffffffffffffff20 >> 0x20));
    RVar10 = fullConvertCase((char32_t)((ulong)pQVar12 >> 0x20),(Case)pQVar12);
    local_28 = RVar10.chars;
    local_20 = CONCAT11(local_20._1_1_,RVar10.sz);
    local_18.nSpans._0_2_ = local_20;
    local_18.spans = (Span *)local_28;
    qVar2 = R::size(&local_18);
    if (qVar2 < '\x02') {
      QChar::QChar<char16_t,_true>(&local_4a,(char16_t)local_18.spans);
      *(char16_t *)&(local_70->d).d = local_4a.ucs;
      local_70 = (QString *)((long)&(local_70->d).d + 2);
    }
    else {
      QChar::QChar<char16_t,_true>(&local_2a,(char16_t)local_18.spans);
      pQVar9 = local_70;
      bVar3 = ::operator==((QChar *)in_stack_ffffffffffffff20,(QChar *)in_stack_ffffffffffffff18);
      uVar11 = false;
      __c_00 = extraout_EDX;
      if (bVar3) {
        qVar2 = R::size(&local_18);
        uVar11 = qVar2 == '\x02';
        __c_00 = extraout_EDX_00;
      }
      if ((bool)uVar11 == false) {
        pcVar5 = QStringIterator::index((QStringIterator *)&stack0x00000008,(char *)pQVar9,__c_00);
        pQVar6 = (QChar *)(pcVar5 + -1);
        pQVar7 = QString::constBegin((QString *)0x16948a);
        pQVar8 = (QStringIterator *)((long)local_70 - (long)pQVar7 >> 1);
        in_stack_ffffffffffffff28 = pQVar8;
        R::data(&local_18);
        R::size(&local_18);
        QString::replace((QString *)CONCAT17(uVar11,in_stack_ffffffffffffff58),
                         (qsizetype)in_stack_ffffffffffffff50,(qsizetype)in_stack_ffffffffffffff48,
                         in_stack_ffffffffffffff40,(qsizetype)in_stack_ffffffffffffff38);
        in_stack_ffffffffffffff38 = QString::constBegin((QString *)0x1694ed);
        in_stack_ffffffffffffff38 = in_stack_ffffffffffffff38 + (long)pQVar8;
        qVar2 = R::size(&local_18);
        pQVar9 = (QString *)(in_stack_ffffffffffffff38 + (int)qVar2);
        in_stack_ffffffffffffff48 = QString::constBegin((QString *)0x16952c);
        qVar2 = R::size(&local_18);
        in_stack_ffffffffffffff50 = (char *)((long)&pQVar6->ucs + (long)qVar2);
        pQVar7 = QString::constEnd(local_70);
        QStringIterator::QStringIterator
                  (&local_48,in_stack_ffffffffffffff48,(qsizetype)in_stack_ffffffffffffff50,pQVar7);
        in_stack_00000008 = local_48.i;
        in_stack_00000010 = local_48.pos;
        in_stack_00000018 = local_48.e;
        in_stack_ffffffffffffff20 = local_70;
        in_stack_ffffffffffffff40 = pQVar6;
        local_70 = pQVar9;
      }
      else {
        pDVar1 = &local_70->d;
        QChar::QChar<char16_t,_true>(&local_2c,local_18.spans._2_2_);
        local_70 = (QString *)((long)&(local_70->d).d + 4);
        *(char16_t *)((long)&pDVar1->d + 2) = local_2c.ucs;
      }
    }
    bVar3 = QStringIterator::hasNext((QStringIterator *)0x1695e6);
  } while (bVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE
static QString detachAndConvertCase(T &str, QStringIterator it, QUnicodeTables::Case which)
{
    Q_ASSERT(!str.isEmpty());
    QString s = std::move(str);         // will copy if T is const QString
    QChar *pp = s.begin() + it.index(); // will detach if necessary

    do {
        const auto folded = fullConvertCase(it.next(), which);
        if (Q_UNLIKELY(folded.size() > 1)) {
            if (folded.chars[0] == *pp && folded.size() == 2) {
                // special case: only second actually changed (e.g. surrogate pairs),
                // avoid slow case
                ++pp;
                *pp++ = folded.chars[1];
            } else {
                // slow path: the string is growing
                qsizetype inpos = it.index() - 1;
                qsizetype outpos = pp - s.constBegin();

                s.replace(outpos, 1, reinterpret_cast<const QChar *>(folded.data()), folded.size());
                pp = const_cast<QChar *>(s.constBegin()) + outpos + folded.size();

                // Adjust the input iterator if we are performing an in-place conversion
                if constexpr (!std::is_const<T>::value)
                    it = QStringIterator(s.constBegin(), inpos + folded.size(), s.constEnd());
            }
        } else {
            *pp++ = folded.chars[0];
        }
    } while (it.hasNext());

    return s;
}